

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  parasail_result_t *ppVar9;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *__dest;
  __m128i *ptr_00;
  ulong uVar10;
  uint uVar11;
  __m128i *palVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 extraout_RDX;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  ulong size;
  int iVar24;
  uint uVar25;
  int iVar30;
  int iVar32;
  int iVar33;
  uint uVar34;
  undefined1 auVar26 [16];
  int iVar35;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar31;
  undefined1 auVar29 [16];
  int iVar36;
  uint uVar37;
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  undefined1 auVar38 [16];
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [16];
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  __m128i c;
  __m128i c_00;
  int local_168;
  uint local_164;
  size_t len;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar21 = profile->s1Len;
        uVar8 = (ulong)uVar21;
        if ((int)uVar21 < 1) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_table_scan_profile_sse41_128_32_cold_1();
        }
        else {
          uVar17 = uVar8 + 3;
          iVar24 = ppVar4->min;
          uVar19 = 0x80000000 - iVar24;
          if (iVar24 != -open && SBORROW4(iVar24,-open) == iVar24 + open < 0) {
            uVar19 = open | 0x80000000;
          }
          uVar7 = 0x7ffffffe - ppVar4->max;
          ppVar9 = parasail_result_new_table1((uint)uVar17 & 0x7ffffffc,s2Len);
          if (ppVar9 != (parasail_result_t *)0x0) {
            size = uVar17 >> 2;
            ppVar9->flag = ppVar9->flag | 0x4420404;
            b = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            __dest = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (__dest == (__m128i *)0x0 || b_00 == (__m128i *)0x0) ||
                         (ptr == (__m128i *)0x0 || b == (__m128i *)0x0);
            if (ptr_00 != (__m128i *)0x0 &&
                ((__dest != (__m128i *)0x0 && b_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && b != (__m128i *)0x0))) {
              uVar19 = uVar19 + 1;
              uVar23 = (uint)size;
              uVar11 = -(gap * uVar23);
              len = (size_t)uVar11;
              c[0] = size;
              parasail_memset___m128i(b_00,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = size;
              parasail_memset___m128i(b,c_00,len);
              iVar24 = -open;
              iVar30 = -open;
              iVar32 = -open;
              iVar33 = -open;
              palVar12 = ptr_00 + (uVar23 - 1);
              uVar10 = size;
              do {
                *(int *)*palVar12 = iVar24;
                *(int *)((long)*palVar12 + 4) = iVar30;
                *(int *)(*palVar12 + 1) = iVar32;
                *(int *)((long)*palVar12 + 0xc) = iVar33;
                iVar24 = iVar24 - gap;
                iVar30 = iVar30 - gap;
                iVar32 = iVar32 - gap;
                iVar33 = iVar33 - gap;
                palVar12 = palVar12 + -1;
                iVar45 = (int)uVar10;
                uVar14 = iVar45 - 1;
                uVar10 = (ulong)uVar14;
              } while (uVar14 != 0 && 0 < iVar45);
              palVar12 = b_00 + (uVar23 - 1);
              uVar10 = 1;
              if (1 < s2Len) {
                uVar10 = (ulong)(uint)s2Len;
              }
              lVar18 = (ulong)(uVar23 + (uVar23 == 0)) << 4;
              lVar20 = size * (uint)s2Len;
              lVar22 = 0;
              uVar13 = 0;
              local_168 = 0;
              uVar14 = uVar19;
              uVar55 = uVar19;
              uVar56 = uVar19;
              uVar57 = uVar19;
              uVar25 = uVar19;
              uVar31 = uVar19;
              uVar66 = uVar19;
              uVar67 = uVar19;
              uVar62 = uVar19;
              uVar63 = uVar19;
              uVar64 = uVar19;
              uVar65 = uVar19;
              uVar58 = uVar7;
              uVar59 = uVar7;
              uVar60 = uVar7;
              uVar61 = uVar7;
              local_164 = uVar19;
              do {
                iVar24 = ppVar4->mapper[(byte)s2[uVar13]];
                lVar15 = 0;
                auVar38 = (undefined1  [16])0x0;
                iVar30 = 0;
                iVar32 = (int)(*palVar12)[0];
                iVar33 = *(int *)((long)*palVar12 + 4);
                iVar45 = (int)(*palVar12)[1];
                auVar27._0_4_ = uVar19;
                auVar27._4_4_ = uVar19;
                auVar27._8_4_ = uVar19;
                uVar34 = uVar19;
                do {
                  piVar5 = (int *)((long)*b_00 + lVar15);
                  iVar35 = *piVar5;
                  iVar42 = piVar5[1];
                  iVar44 = piVar5[2];
                  iVar6 = piVar5[3];
                  piVar5 = (int *)((long)*b + lVar15);
                  piVar1 = (int *)((long)pvVar3 + lVar15 + size * (long)iVar24 * 0x10);
                  iVar30 = iVar30 + *piVar1;
                  iVar32 = iVar32 + piVar1[1];
                  iVar33 = iVar33 + piVar1[2];
                  iVar45 = iVar45 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar15);
                  iVar36 = auVar38._0_4_ + *piVar1;
                  iVar39 = auVar38._4_4_ + piVar1[1];
                  iVar41 = auVar38._8_4_ + piVar1[2];
                  iVar43 = auVar38._12_4_ + piVar1[3];
                  iVar50 = *piVar5 - gap;
                  iVar51 = piVar5[1] - gap;
                  iVar52 = piVar5[2] - gap;
                  iVar53 = piVar5[3] - gap;
                  auVar27._0_4_ =
                       (uint)((int)auVar27._0_4_ < iVar36) * iVar36 |
                       ((int)auVar27._0_4_ >= iVar36) * auVar27._0_4_;
                  auVar27._4_4_ =
                       (uint)((int)auVar27._4_4_ < iVar39) * iVar39 |
                       ((int)auVar27._4_4_ >= iVar39) * auVar27._4_4_;
                  auVar27._8_4_ =
                       (uint)((int)auVar27._8_4_ < iVar41) * iVar41 |
                       ((int)auVar27._8_4_ >= iVar41) * auVar27._8_4_;
                  uVar34 = (uint)((int)uVar34 < iVar43) * iVar43 | ((int)uVar34 >= iVar43) * uVar34;
                  iVar36 = iVar35 - open;
                  iVar39 = iVar42 - open;
                  iVar41 = iVar44 - open;
                  iVar43 = iVar6 - open;
                  uVar46 = (uint)(iVar36 < iVar50) * iVar50 | (uint)(iVar36 >= iVar50) * iVar36;
                  uVar47 = (uint)(iVar39 < iVar51) * iVar51 | (uint)(iVar39 >= iVar51) * iVar39;
                  uVar48 = (uint)(iVar41 < iVar52) * iVar52 | (uint)(iVar41 >= iVar52) * iVar41;
                  uVar49 = (uint)(iVar43 < iVar53) * iVar53 | (uint)(iVar43 >= iVar53) * iVar43;
                  uVar37 = (iVar30 < (int)uVar46) * uVar46 | (uint)(iVar30 >= (int)uVar46) * iVar30;
                  uVar40 = (iVar32 < (int)uVar47) * uVar47 | (uint)(iVar32 >= (int)uVar47) * iVar32;
                  auVar38._0_8_ = CONCAT44(uVar40,uVar37);
                  auVar38._8_4_ =
                       (iVar33 < (int)uVar48) * uVar48 | (uint)(iVar33 >= (int)uVar48) * iVar33;
                  auVar38._12_4_ =
                       (iVar45 < (int)uVar49) * uVar49 | (uint)(iVar45 >= (int)uVar49) * iVar45;
                  puVar2 = (uint *)((long)*b + lVar15);
                  *puVar2 = uVar46;
                  puVar2[1] = uVar47;
                  puVar2[2] = uVar48;
                  puVar2[3] = uVar49;
                  *(undefined1 (*) [16])((long)*ptr + lVar15) = auVar38;
                  lVar15 = lVar15 + 0x10;
                  iVar30 = iVar35;
                  iVar32 = iVar42;
                  iVar33 = iVar44;
                  iVar45 = iVar6;
                } while (lVar18 != lVar15);
                iVar24 = (int)(*ptr_00)[0];
                iVar30 = *(int *)((long)*ptr_00 + 4) + uVar37;
                iVar32 = (int)(*ptr_00)[1] + uVar40;
                iVar33 = *(int *)((long)*ptr_00 + 0xc) + auVar38._8_4_;
                auVar26._0_4_ =
                     (uint)((int)auVar27._0_4_ < iVar24) * iVar24 |
                     ((int)auVar27._0_4_ >= iVar24) * auVar27._0_4_;
                auVar26._4_4_ =
                     (uint)((int)auVar27._4_4_ < iVar30) * iVar30 |
                     ((int)auVar27._4_4_ >= iVar30) * auVar27._4_4_;
                auVar26._8_4_ =
                     (uint)((int)auVar27._8_4_ < iVar32) * iVar32 |
                     ((int)auVar27._8_4_ >= iVar32) * auVar27._8_4_;
                auVar26._12_4_ =
                     (uint)((int)uVar34 < iVar33) * iVar33 | ((int)uVar34 >= iVar33) * uVar34;
                iVar24 = 1;
                do {
                  iVar32 = auVar26._0_4_;
                  iVar30 = iVar32 + uVar11;
                  iVar45 = auVar26._4_4_;
                  iVar42 = auVar26._8_4_;
                  iVar33 = iVar45 + uVar11;
                  iVar35 = iVar42 + uVar11;
                  auVar27._0_4_ =
                       (uint)((int)uVar19 < iVar32) * iVar32 | ((int)uVar19 >= iVar32) * uVar19;
                  auVar27._4_4_ =
                       (uint)(iVar30 < iVar45) * iVar45 | (uint)(iVar30 >= iVar45) * iVar30;
                  auVar27._8_4_ =
                       (uint)(iVar33 < iVar42) * iVar42 | (uint)(iVar33 >= iVar42) * iVar33;
                  iVar30 = auVar26._12_4_;
                  auVar27._12_4_ =
                       (uint)(iVar35 < iVar30) * iVar30 | (uint)(iVar35 >= iVar30) * iVar35;
                  iVar24 = iVar24 + -1;
                  auVar26 = auVar27;
                } while (iVar24 == 0);
                iVar33 = (-1 < auVar38._0_8_ << 0x20) * uVar37;
                iVar32 = (-1 < (int)uVar40) * uVar40;
                iVar30 = (-1 < (long)(auVar38._8_8_ << 0x20 | (ulong)uVar40)) * auVar38._8_4_;
                iVar24 = (0 < (int)uVar19) * uVar19;
                uVar40 = (iVar33 < (int)auVar27._0_4_) * auVar27._0_4_ |
                         (uint)(iVar33 >= (int)auVar27._0_4_) * iVar33;
                uVar37 = (iVar32 < (int)auVar27._4_4_) * auVar27._4_4_ |
                         (uint)(iVar32 >= (int)auVar27._4_4_) * iVar32;
                uVar34 = (iVar30 < (int)auVar27._8_4_) * auVar27._8_4_ |
                         (uint)(iVar30 >= (int)auVar27._8_4_) * iVar30;
                lVar16 = 0;
                lVar15 = lVar22;
                uVar46 = uVar19;
                do {
                  iVar30 = uVar46 - gap;
                  iVar32 = auVar27._0_4_ - gap;
                  iVar33 = auVar27._4_4_ - gap;
                  iVar45 = auVar27._8_4_ - gap;
                  iVar24 = iVar24 - open;
                  iVar35 = uVar40 - open;
                  iVar42 = uVar37 - open;
                  iVar44 = uVar34 - open;
                  uVar46 = (uint)(iVar30 < iVar24) * iVar24 | (uint)(iVar30 >= iVar24) * iVar30;
                  auVar27._0_4_ =
                       (uint)(iVar32 < iVar35) * iVar35 | (uint)(iVar32 >= iVar35) * iVar32;
                  auVar27._4_4_ =
                       (uint)(iVar33 < iVar42) * iVar42 | (uint)(iVar33 >= iVar42) * iVar33;
                  auVar27._8_4_ =
                       (uint)(iVar45 < iVar44) * iVar44 | (uint)(iVar45 >= iVar44) * iVar45;
                  piVar5 = (int *)((long)*ptr + lVar16);
                  iVar24 = *piVar5;
                  iVar30 = piVar5[1];
                  iVar32 = piVar5[2];
                  iVar33 = piVar5[3];
                  uVar47 = (iVar24 < (int)uVar46) * uVar46 | (uint)(iVar24 >= (int)uVar46) * iVar24;
                  uVar40 = (iVar30 < (int)auVar27._0_4_) * auVar27._0_4_ |
                           (uint)(iVar30 >= (int)auVar27._0_4_) * iVar30;
                  uVar37 = (iVar32 < (int)auVar27._4_4_) * auVar27._4_4_ |
                           (uint)(iVar32 >= (int)auVar27._4_4_) * iVar32;
                  uVar34 = (iVar33 < (int)auVar27._8_4_) * auVar27._8_4_ |
                           (uint)(iVar33 >= (int)auVar27._8_4_) * iVar33;
                  iVar24 = (-1 < (int)uVar47) * uVar47;
                  uVar40 = (-1 < (int)uVar40) * uVar40;
                  uVar37 = (-1 < (int)uVar37) * uVar37;
                  uVar34 = (-1 < (int)uVar34) * uVar34;
                  piVar5 = (int *)((long)*b_00 + lVar16);
                  *piVar5 = iVar24;
                  piVar5[1] = uVar40;
                  piVar5[2] = uVar37;
                  piVar5[3] = uVar34;
                  uVar58 = (uint)(iVar24 < (int)uVar58) * iVar24 | (iVar24 >= (int)uVar58) * uVar58;
                  uVar59 = ((int)uVar40 < (int)uVar59) * uVar40 |
                           ((int)uVar40 >= (int)uVar59) * uVar59;
                  uVar60 = ((int)uVar37 < (int)uVar60) * uVar37 |
                           ((int)uVar37 >= (int)uVar60) * uVar60;
                  uVar61 = ((int)uVar34 < (int)uVar61) * uVar34 |
                           ((int)uVar34 >= (int)uVar61) * uVar61;
                  uVar14 = (uint)((int)uVar14 < iVar24) * iVar24 | ((int)uVar14 >= iVar24) * uVar14;
                  uVar55 = ((int)uVar55 < (int)uVar40) * uVar40 |
                           ((int)uVar55 >= (int)uVar40) * uVar55;
                  uVar56 = ((int)uVar56 < (int)uVar37) * uVar37 |
                           ((int)uVar56 >= (int)uVar37) * uVar56;
                  uVar57 = ((int)uVar57 < (int)uVar34) * uVar34 |
                           ((int)uVar57 >= (int)uVar34) * uVar57;
                  piVar5 = ((ppVar9->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar15) = iVar24;
                  *(uint *)((long)piVar5 + lVar20 * 4 + lVar15) = uVar40;
                  *(uint *)((long)piVar5 + lVar20 * 8 + lVar15) = uVar37;
                  *(uint *)((long)piVar5 + lVar20 * 0xc + lVar15) = uVar34;
                  uVar62 = (uint)((int)uVar62 < iVar24) * iVar24 | ((int)uVar62 >= iVar24) * uVar62;
                  uVar63 = ((int)uVar63 < (int)uVar40) * uVar40 |
                           ((int)uVar63 >= (int)uVar40) * uVar63;
                  uVar64 = ((int)uVar64 < (int)uVar37) * uVar37 |
                           ((int)uVar64 >= (int)uVar37) * uVar64;
                  uVar65 = ((int)uVar65 < (int)uVar34) * uVar34 |
                           ((int)uVar65 >= (int)uVar34) * uVar65;
                  lVar16 = lVar16 + 0x10;
                  lVar15 = lVar15 + (ulong)(uint)s2Len * 4;
                } while (lVar18 != lVar16);
                auVar28._0_4_ = -(uint)((int)uVar25 < (int)uVar62);
                auVar28._4_4_ = -(uint)((int)uVar31 < (int)uVar63);
                auVar28._8_4_ = -(uint)((int)uVar66 < (int)uVar64);
                auVar28._12_4_ = -(uint)((int)uVar67 < (int)uVar65);
                iVar24 = movmskps((int)lVar15,auVar28);
                if (iVar24 != 0) {
                  uVar25 = ((int)uVar64 < (int)uVar62) * uVar62 |
                           ((int)uVar64 >= (int)uVar62) * uVar64;
                  uVar31 = ((int)uVar65 < (int)uVar63) * uVar63 |
                           ((int)uVar65 >= (int)uVar63) * uVar65;
                  uVar25 = ((int)uVar31 < (int)uVar25) * uVar25 |
                           ((int)uVar31 >= (int)uVar25) * uVar31;
                  memcpy(__dest,b_00,size << 4);
                  local_168 = (int)uVar13;
                  uVar31 = uVar25;
                  uVar66 = uVar25;
                  uVar67 = uVar25;
                  local_164 = uVar25;
                }
                uVar13 = uVar13 + 1;
                lVar22 = lVar22 + 4;
              } while (uVar13 != uVar10);
              if ((uVar17 & 0x7ffffffc) != 0) {
                uVar11 = (uVar23 & 0x1fffffff) << 2;
                uVar13 = (ulong)uVar11;
                uVar17 = 0;
                do {
                  if ((*(uint *)((long)*__dest + uVar17 * 4) == local_164) &&
                     (uVar21 = ((uint)uVar17 & 3) * uVar23 + ((uint)(uVar17 >> 2) & 0x3fffffff),
                     (int)uVar21 < (int)uVar8)) {
                    uVar8 = (ulong)uVar21;
                  }
                  uVar21 = (uint)uVar8;
                  uVar17 = uVar17 + 1;
                } while (uVar11 != (uint)uVar17);
              }
              auVar29._0_4_ = -(uint)((int)uVar58 < (int)uVar19);
              auVar29._4_4_ = -(uint)((int)uVar59 < (int)uVar19);
              auVar29._8_4_ = -(uint)((int)uVar60 < (int)uVar19);
              auVar29._12_4_ = -(uint)((int)uVar61 < (int)uVar19);
              auVar54._0_4_ = -(uint)((int)uVar7 < (int)uVar14);
              auVar54._4_4_ = -(uint)((int)uVar7 < (int)uVar55);
              auVar54._8_4_ = -(uint)((int)uVar7 < (int)uVar56);
              auVar54._12_4_ = -(uint)((int)uVar7 < (int)uVar57);
              iVar24 = movmskps((int)uVar13,auVar54 | auVar29);
              if (iVar24 != 0) {
                *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                local_164 = 0;
                local_168 = 0;
                uVar21 = 0;
              }
              ppVar9->score = local_164;
              ppVar9->end_query = uVar21;
              ppVar9->end_ref = local_168;
              parasail_free(ptr_00);
              parasail_free(__dest);
              parasail_free(b_00);
              parasail_free(ptr);
              parasail_free(b);
              return ppVar9;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        vH = _mm_max_epi32(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            vH = _mm_max_epi32(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}